

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_picnic_test.cpp
# Opt level: O0

void __thiscall
multiple_messagescase::_impl<picnic_params_t>(multiple_messagescase *this,anon_enum_32 *parameters)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  undefined4 *in_RSI;
  size_t signature_len;
  size_t message_size;
  size_t c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  picnic_privatekey_t sk;
  picnic_publickey_t pk;
  size_t max_signature_size;
  context_frame context_frame_790;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_00000e70;
  lazy_ostream *in_stack_fffffffffffffa98;
  lazy_ostream *in_stack_fffffffffffffaa0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  *in_stack_fffffffffffffaa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  undefined4 in_stack_fffffffffffffabc;
  const_string *in_stack_fffffffffffffac0;
  const_string *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  const_string *in_stack_fffffffffffffae8;
  lazy_ostream *in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffb20;
  value_expr<const_unsigned_long_&> *in_stack_fffffffffffffb28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  lazy_ostream local_460 [2];
  undefined4 local_43c;
  assertion_result local_430;
  assertion_result local_3a8;
  basic_cstring<const_char> local_380;
  basic_cstring<const_char> local_370;
  basic_cstring<const_char> local_360;
  lazy_ostream local_350 [2];
  undefined1 local_32b;
  assertion_result local_328;
  basic_cstring<const_char> local_300;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  lazy_ostream local_2d0 [2];
  undefined1 local_2ab;
  assertion_result local_2a8;
  basic_cstring<const_char> local_280;
  long local_270;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_268;
  ulong local_260;
  basic_cstring<const_char> local_228;
  basic_cstring<const_char> local_218;
  lazy_ostream local_208 [2];
  undefined1 local_1e3;
  assertion_result local_1e0;
  basic_cstring<const_char> local_1b8;
  undefined1 local_1a2 [97];
  undefined1 local_141 [65];
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  lazy_ostream local_e0 [3];
  assertion_result local_b0;
  basic_cstring<const_char> local_88;
  long local_78;
  undefined8 local_60;
  context_frame local_14;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            (&in_stack_fffffffffffffaa8->super_lazy_ostream,(char (*) [16])in_stack_fffffffffffffaa0
            );
  local_60 = picnic_get_param_name(*local_10);
  boost::unit_test::operator<<(in_stack_fffffffffffffaa8,(char **)in_stack_fffffffffffffaa0);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
              *)0x1ca1cf);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             0x1ca1dc);
  bVar2 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_14);
  if (bVar2) {
    local_78 = picnic_signature_size(*local_10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 in_stack_fffffffffffffad8);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffffaa8,(unsigned_long *)in_stack_fffffffffffffaa0);
      boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
                (in_stack_fffffffffffffb28,SUB81((ulong)in_stack_fffffffffffffb20 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,"max_signature_size",0x12);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffffaa8->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_b0,local_e0,&local_100,0x51,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1ca36b);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1ca378);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                 CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                 in_stack_fffffffffffffad8);
      iVar3 = picnic_keygen(*local_10,local_141,local_1a2);
      local_1e3 = iVar3 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)in_stack_fffffffffffffaa8,(bool *)in_stack_fffffffffffffaa0);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffffb28,
                 SUB81((ulong)in_stack_fffffffffffffb20 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_218,"!picnic_keygen(parameters, &pk, &sk)",0x24);
      boost::unit_test::operator<<
                (&in_stack_fffffffffffffaa8->super_lazy_ostream,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_228,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                 ,0x5e);
      boost::test_tools::tt_detail::report_assertion
                (&local_1e0,local_208,&local_228,0x55,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1ca500);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1ca50d);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca527);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca534);
    for (local_260 = 0; local_260 < 0x20; local_260 = local_260 + 1) {
      local_268 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  (local_260 * 0x200 + 0x200);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffac0,
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffac0,
                 CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      (anonymous_namespace)::
      randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_00000e70);
      (anonymous_namespace)::
      randomize_container<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (in_stack_00000e70);
      local_270 = local_78;
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_280,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffad8);
        puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca62f);
        this_00 = local_268;
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca654);
        iVar3 = picnic_sign(local_1a2,puVar4,this_00,puVar5,&local_270);
        local_2ab = iVar3 == 0;
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_fffffffffffffaa8,(bool *)in_stack_fffffffffffffaa0);
        boost::test_tools::assertion::value_expr<bool>::evaluate
                  ((value_expr<bool> *)this_00,SUB81((ulong)puVar4 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_2e0,
                   "!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len)"
                   ,0x51);
        boost::unit_test::operator<<
                  (&in_stack_fffffffffffffaa8->super_lazy_ostream,
                   (basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_2f0,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::test_tools::tt_detail::report_assertion
                  (&local_2a8,local_2d0,&local_2f0,0x62,CHECK,CHECK_BUILT_ASSERTION,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)0x1ca779);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1ca786);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_300,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffad8);
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca7f9);
        pvVar1 = local_268;
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca818);
        iVar3 = picnic_verify(local_141,puVar5,pvVar1,puVar6,local_270);
        local_32b = iVar3 == 0;
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_fffffffffffffaa8,(bool *)in_stack_fffffffffffffaa0);
        boost::test_tools::assertion::value_expr<bool>::evaluate
                  ((value_expr<bool> *)this_00,SUB81((ulong)puVar4 >> 0x38,0));
        in_stack_fffffffffffffaf0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_360,
                   "!picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len)"
                   ,0x52);
        boost::unit_test::operator<<
                  (&in_stack_fffffffffffffaa8->super_lazy_ostream,
                   (basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_370,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::test_tools::tt_detail::report_assertion
                  (&local_328,local_350,&local_370,100,CHECK,CHECK_BUILT_ASSERTION,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)0x1ca92b);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1ca938);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        in_stack_fffffffffffffae8 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_380,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffad8);
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca9ab);
        in_stack_fffffffffffffad8 =
             (const_string *)
             ((long)&local_268[-1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1ca9cd);
        in_stack_fffffffffffffae4 =
             picnic_verify(local_141,puVar5,in_stack_fffffffffffffad8,puVar6,local_270);
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_fffffffffffffaa8,(int *)in_stack_fffffffffffffaa0);
        boost::test_tools::assertion::value_expr<int>::evaluate
                  ((value_expr<int> *)this_00,SUB81((ulong)puVar4 >> 0x38,0));
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)&stack0xfffffffffffffc18,
                   "picnic_verify(&pk, message.data(), message_size - 1, signature.data(), signature_len)"
                   ,0x55);
        boost::unit_test::operator<<
                  (&in_stack_fffffffffffffaa8->super_lazy_ostream,
                   (basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)&stack0xfffffffffffffc08,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::test_tools::tt_detail::report_assertion
                  (&local_3a8,(lazy_ostream *)&stack0xfffffffffffffc28,
                   (const_string *)&stack0xfffffffffffffc08,0x67,CHECK,CHECK_BUILT_ASSERTION,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)0x1caadd);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1caaea);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
      do {
        in_stack_fffffffffffffac0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  ((basic_cstring<const_char> *)&stack0xfffffffffffffbf8,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  ((unit_test_log_t *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
                   in_stack_fffffffffffffad8);
        in_stack_fffffffffffffaa8 =
             (lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cab5d);
        in_stack_fffffffffffffab0 = local_268;
        puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1cab7c);
        in_stack_fffffffffffffabc =
             picnic_verify(local_141,in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,puVar5,
                           local_270 + -1);
        local_43c = in_stack_fffffffffffffabc;
        boost::test_tools::assertion::seed::operator->*
                  ((seed *)in_stack_fffffffffffffaa8,(int *)in_stack_fffffffffffffaa0);
        boost::test_tools::assertion::value_expr<int>::evaluate
                  ((value_expr<int> *)this_00,SUB81((ulong)puVar4 >> 0x38,0));
        in_stack_fffffffffffffaa0 = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_470,
                   "picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len - 1)"
                   ,0x55);
        boost::unit_test::operator<<
                  (&in_stack_fffffffffffffaa8->super_lazy_ostream,
                   (basic_cstring<const_char> *)in_stack_fffffffffffffaa0);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_480,
                   "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/extended_picnic_test.cpp"
                   ,0x5e);
        boost::test_tools::tt_detail::report_assertion
                  (&local_430,local_460,&local_480,0x6a,CHECK,CHECK_BUILT_ASSERTION,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)0x1cac8f);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1cac9c);
        bVar2 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar2);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffab0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffab0);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1caf34);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(multiple_messages, all_supported_parameters(), parameters) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(parameters)) {
    const size_t max_signature_size = picnic_signature_size(parameters);
    BOOST_TEST(max_signature_size);

    picnic_publickey_t pk;
    picnic_privatekey_t sk;
    BOOST_TEST(!picnic_keygen(parameters, &pk, &sk));

    std::vector<uint8_t> signature, message;
    for (size_t c = 0; c < rep; ++c) {
      const size_t message_size = (c + 1) * message_inc;

      signature.resize(max_signature_size);
      message.resize(message_size);
      // fill with random data
      randomize_container(message);
      randomize_container(signature);

      size_t signature_len = max_signature_size;
      BOOST_TEST(!picnic_sign(&sk, message.data(), message_size, signature.data(), &signature_len));
      BOOST_TEST(
          !picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len));
      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size - 1, signature.data(), signature_len));
      // must fail
      BOOST_TEST(
          picnic_verify(&pk, message.data(), message_size, signature.data(), signature_len - 1));
    }
  }
}